

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

ZoneHashEntry * __thiscall
AbbrHashEntry::search(AbbrHashEntry *this,int start_idx,ZoneSearchSpec *spec,ZoneHashEntry *zone)

{
  int iVar1;
  int i;
  char *pcVar2;
  int iVar3;
  
  iVar1 = *(int *)&(this->super_CVmHashEntryCI).super_CVmHashEntry.field_0x24;
  iVar3 = iVar1 - start_idx;
  if (iVar3 != 0 && start_idx <= iVar1) {
    pcVar2 = &this->entries[start_idx].dst;
    do {
      if (((((AbbrToZone *)(pcVar2 + -0xc))->zone == zone) &&
          (*(int *)(pcVar2 + -4) == spec->gmtofs)) && (*pcVar2 == spec->dst)) {
        return ((AbbrToZone *)(pcVar2 + -0xc))->zone;
      }
      pcVar2 = pcVar2 + 0x10;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return (ZoneHashEntry *)0x0;
}

Assistant:

ZoneHashEntry *search(int start_idx, const ZoneSearchSpec *spec,
                          const ZoneHashEntry *zone)
    {
        for (int i = start_idx ; i < entry_cnt ; ++i)
        {
            if (entries[i].zone == zone
                && entries[i].gmtofs == spec->gmtofs
                && entries[i].dst == spec->dst)
                return entries[i].zone;
        }

        return 0;
    }